

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

void __thiscall
QOpenGLShaderProgram::setUniformValue
          (QOpenGLShaderProgram *this,char *name,GLfloat x,GLfloat y,GLfloat z)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = uniformLocation(this,name);
  if (iVar2 != -1) {
    (**(code **)(**(long **)(*(long *)&this->field_0x8 + 0xd0) + 0x3c8))(iVar2,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue
        (const char *name, GLfloat x, GLfloat y, GLfloat z)
{
    setUniformValue(uniformLocation(name), x, y, z);
}